

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

Real amrex::Amr::computeOptimalSubcycling
               (int n,int *best,Real *dt_max,Real *est_work,int *cycle_max)

{
  Real RVar1;
  reference pvVar2;
  double *pdVar3;
  double *in_RCX;
  double *in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  int i_3;
  int i_2;
  int i_1;
  int temp_cand;
  int candidate;
  int i;
  int limit;
  Real work;
  Real dt;
  Real ratio;
  Real best_dt;
  Real best_ratio;
  vector<int,_std::allocator<int>_> cycles;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  size_type in_stack_ffffffffffffff38;
  vector<int,_std::allocator<int>_> *this;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff40;
  int local_a8;
  int local_a4;
  double local_a0;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  double local_80;
  double local_78;
  double local_70;
  Real local_68;
  double local_60;
  vector<int,_std::allocator<int>_> local_40;
  long local_28;
  double *local_20;
  double *local_18;
  long local_10;
  int local_4;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  std::allocator<int>::allocator((allocator<int> *)0x10f061d);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  std::allocator<int>::~allocator((allocator<int> *)0x10f0643);
  local_60 = 1e+200;
  local_68 = 0.0;
  local_84 = 1;
  for (local_88 = 1; local_88 < local_4; local_88 = local_88 + 1) {
    local_84 = *(int *)(local_28 + (long)local_88 * 4) * local_84;
  }
  for (local_8c = 0; RVar1 = local_68, local_8c < local_84; local_8c = local_8c + 1) {
    local_90 = local_8c;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,0);
    *pvVar2 = 1;
    local_78 = *local_18;
    local_80 = *local_20;
    for (local_94 = 1; local_94 < local_4; local_94 = local_94 + 1) {
      in_stack_ffffffffffffff30 = local_90 % *(int *)(local_28 + (long)local_94 * 4) + 1;
      this = &local_40;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](this,(long)(local_94 + -1));
      in_stack_ffffffffffffff34 = in_stack_ffffffffffffff30 * *pvVar2;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](this,(long)local_94);
      *pvVar2 = in_stack_ffffffffffffff34;
      local_90 = local_90 / *(int *)(local_28 + (long)local_94 * 4);
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](this,(long)local_94);
      local_a0 = (double)*pvVar2 * local_18[local_94];
      pdVar3 = std::min<double>(&local_78,&local_a0);
      local_78 = *pdVar3;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_94);
      local_80 = (double)*pvVar2 * local_20[local_94] + local_80;
    }
    local_70 = local_80 / local_78;
    if (local_70 < local_60) {
      for (local_a4 = 0; local_a4 < local_4; local_a4 = local_a4 + 1) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_a4);
        *(value_type *)(local_10 + (long)local_a4 * 4) = *pvVar2;
      }
      local_60 = local_70;
      local_68 = local_78;
    }
  }
  while (local_a8 = local_4 + -1, 0 < local_a8) {
    *(int *)(local_10 + (long)local_a8 * 4) =
         *(int *)(local_10 + (long)local_a8 * 4) / *(int *)(local_10 + (long)(local_4 + -2) * 4);
    local_4 = local_a8;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  return RVar1;
}

Assistant:

Real
Amr::computeOptimalSubcycling(int n, int* best, Real* dt_max, Real* est_work, int* cycle_max)
{
    BL_ASSERT(cycle_max[0] == 1);
    // internally these represent the total number of steps at a level,
    // not the number of cycles
    std::vector<int> cycles(n);
#ifdef AMREX_USE_FLOAT
    Real best_ratio = 1e30f;
#else
    Real best_ratio = 1e200;
#endif
    Real best_dt = 0;
    Real ratio;
    Real dt;
    Real work;
    int limit = 1;
    // This provides a memory efficient way to test all candidates
    for (int i = 1; i < n; i++)
        limit *= cycle_max[i];
    for (int candidate = 0; candidate < limit; candidate++)
    {
        int temp_cand = candidate;
        cycles[0] = 1;
        dt = dt_max[0];
        work = est_work[0];
        for (int i  = 1; i < n; i++)
        {
            // grab the relevant "digit" and shift over.
            cycles[i] = (1 + temp_cand%cycle_max[i]) * cycles[i-1];
            temp_cand /= cycle_max[i];
            dt = std::min(dt, cycles[i]*dt_max[i]);
            work += cycles[i]*est_work[i];
        }
        ratio = work/dt;
        if (ratio < best_ratio)
        {
            for (int i  = 0; i < n; i++)
                best[i] = cycles[i];
            best_ratio = ratio;
            best_dt = dt;
        }
    }
    //
    // Now we convert best back to n_cycles format
    //
    for (int i = n-1; i > 0; i--)
        best[i] /= best[i-1];
    return best_dt;
}